

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerMSL::declare_constant_arrays(CompilerMSL *this)

{
  uint uVar1;
  size_t sVar2;
  Variant *pVVar3;
  bool bVar4;
  SPIRConstant *c;
  SPIRType *type;
  undefined1 *extraout_RAX;
  undefined1 *puVar5;
  TypedID<(spirv_cross::Types)0> *pTVar6;
  long lVar7;
  string name;
  LoopLock LStack_f8;
  ulong local_f0;
  string local_e8;
  TypedID<(spirv_cross::Types)0> *local_c8;
  size_t local_c0;
  long local_b8;
  string local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  local_c0 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[4].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  ParsedIR::create_loop_hard_lock(&(this->super_CompilerGLSL).super_Compiler.ir);
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 == 0) {
    ParsedIR::LoopLock::~LoopLock(&LStack_f8);
  }
  else {
    pTVar6 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_b8 = sVar2 << 2;
    lVar7 = 0;
    local_f0 = 0;
    local_c8 = pTVar6;
    do {
      uVar1 = *(uint *)((long)&pTVar6->id + lVar7);
      pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar3[uVar1].type == TypeConstant) {
        c = Variant::get<spirv_cross::SPIRConstant>(pVVar3 + uVar1);
        if (c->specialization == false) {
          type = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)&(c->super_IVariant).field_0xc);
          bVar4 = Compiler::is_array((Compiler *)this,type);
          if (bVar4) {
            if (local_c0 == 1) {
              bVar4 = Compiler::is_scalar((Compiler *)this,type);
              if (!bVar4) {
                bVar4 = Compiler::is_vector((Compiler *)this,type);
                if (!bVar4) goto LAB_0020b9f6;
              }
            }
            CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(c->super_IVariant).self.id);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (local_90,this,(ulong)(c->super_IVariant).self.id,1);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])(&local_50,this,type);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            local_e8.field_2._M_allocated_capacity = 0x746e6174736e6f63;
            local_e8._M_string_length = 8;
            local_e8.field_2._M_local_buf[8] = '\0';
            inject_top_level_storage_qualifier(&local_b0,&local_50,&local_e8);
            CompilerGLSL::constant_expression_abi_cxx11_
                      (&local_70,&this->super_CompilerGLSL,c,false,false);
            pTVar6 = local_c8;
            CompilerGLSL::
            statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                      (&this->super_CompilerGLSL,&local_b0,(char (*) [4])0x2d6e67,&local_70,
                       (char (*) [2])0x2d6cfb);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            puVar5 = local_80;
            if (local_90[0] != puVar5) {
              operator_delete(local_90[0]);
              puVar5 = extraout_RAX;
            }
            local_f0 = CONCAT71((int7)((ulong)puVar5 >> 8),1);
          }
        }
      }
LAB_0020b9f6:
      lVar7 = lVar7 + 4;
    } while (local_b8 != lVar7);
    ParsedIR::LoopLock::~LoopLock(&LStack_f8);
    if ((local_f0 & 1) != 0) {
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2b1c7b);
    }
  }
  return;
}

Assistant:

void CompilerMSL::declare_constant_arrays()
{
	bool fully_inlined = ir.ids_for_type[TypeFunction].size() == 1;

	// MSL cannot declare arrays inline (except when declaring a variable), so we must move them out to
	// global constants directly, so we are able to use constants as variable expressions.
	bool emitted = false;

	ir.for_each_typed_id<SPIRConstant>([&](uint32_t, SPIRConstant &c) {
		if (c.specialization)
			return;

		auto &type = this->get<SPIRType>(c.constant_type);
		// Constant arrays of non-primitive types (i.e. matrices) won't link properly into Metal libraries.
		// FIXME: However, hoisting constants to main() means we need to pass down constant arrays to leaf functions if they are used there.
		// If there are multiple functions in the module, drop this case to avoid breaking use cases which do not need to
		// link into Metal libraries. This is hacky.
		if (is_array(type) && (!fully_inlined || is_scalar(type) || is_vector(type)))
		{
			add_resource_name(c.self);
			auto name = to_name(c.self);
			statement(inject_top_level_storage_qualifier(variable_decl(type, name), "constant"),
			          " = ", constant_expression(c), ";");
			emitted = true;
		}
	});

	if (emitted)
		statement("");
}